

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_TakeFromTarget
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  PClass *pPVar2;
  int iVar3;
  char *__assertion;
  AActor *receiver;
  undefined8 *puVar4;
  bool bVar5;
  int in_stack_ffffffffffffffb8;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_003d1ae2;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003d1ad2:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d1ae2:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xa2c,
                  "int AF_AActor_A_TakeFromTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  puVar4 = (undefined8 *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (puVar4 == (undefined8 *)0x0) goto LAB_003d1a6d;
    pPVar2 = (PClass *)puVar4[1];
    if (pPVar2 == (PClass *)0x0) {
      pPVar2 = (PClass *)(**(code **)*puVar4)(puVar4);
      puVar4[1] = pPVar2;
    }
    bVar5 = pPVar2 != (PClass *)0x0;
    if (pPVar2 != pPVar1 && bVar5) {
      do {
        pPVar2 = pPVar2->ParentClass;
        bVar5 = pPVar2 != (PClass *)0x0;
        if (pPVar2 == pPVar1) break;
      } while (pPVar2 != (PClass *)0x0);
    }
    if (!bVar5) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d1ae2;
    }
  }
  else {
    if (puVar4 != (undefined8 *)0x0) goto LAB_003d1ad2;
LAB_003d1a6d:
    puVar4 = (undefined8 *)0x0;
  }
  receiver = (AActor *)puVar4[0x41];
  iVar3 = 0;
  if (receiver != (AActor *)0x0) {
    if (((receiver->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_003d1a94;
    puVar4[0x41] = 0;
  }
  receiver = (AActor *)0x0;
LAB_003d1a94:
  bVar5 = DoTakeInventory(receiver,false,param,defaultparam,numparam,(VMReturn *)defaultparam,
                          in_stack_ffffffffffffffb8);
  if (0 < numret) {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xa2d,
                    "int AF_AActor_A_TakeFromTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (ret->RegType != '\0') {
      __assert_fail("RegType == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                    ,0x13f,"void VMReturn::SetInt(int)");
    }
    *(uint *)ret->Location = (uint)bVar5;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_TakeFromTarget)
{
	PARAM_SELF_PROLOGUE(AActor);
	ACTION_RETURN_BOOL(DoTakeInventory(self->target, false, VM_ARGS_NAMES));
}